

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::set(Solver *this,char *arg,int val)

{
  State SVar1;
  Internal *pIVar2;
  bool bVar3;
  int iVar4;
  char *__ptr;
  size_t sStack_30;
  
  if ((this->internal != (Internal *)0x0) && (this->trace_api_file != (FILE *)0x0)) {
    trace_api_call(this,"set",arg,val);
  }
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::set(const char *, int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
LAB_00683a3f:
    sStack_30 = 0x1f;
  }
  else {
    pIVar2 = this->internal;
    if (pIVar2 == (Internal *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::set(const char *, int)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "internal solver not initialized";
      goto LAB_00683a3f;
    }
    SVar1 = this->_state;
    if ((SVar1 & VALID) != 0) {
      iVar4 = strcmp(arg,"log");
      if (iVar4 == 0) {
LAB_006839b7:
        bVar3 = Options::set(&pIVar2->opts,arg,val);
        return bVar3;
      }
      iVar4 = strcmp(arg,"quiet");
      if (iVar4 == 0) goto LAB_006839b7;
      iVar4 = strcmp(arg,"report");
      if (iVar4 == 0) goto LAB_006839b7;
      iVar4 = strcmp(arg,"verbose");
      if ((SVar1 == CONFIGURING) || (iVar4 == 0)) goto LAB_006839b7;
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::set(const char *, int)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"can only set option \'set (\"%s\", %d)\' right after initialization",arg,
              (ulong)(uint)val);
      fputc(10,_stderr);
      goto LAB_00683a91;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "solver in invalid state";
    sStack_30 = 0x17;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  fputc(10,_stderr);
LAB_00683a91:
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::set (const char *arg, int val) {
  TRACE ("set", arg, val);
  REQUIRE_VALID_STATE ();
  if (strcmp (arg, "log") && strcmp (arg, "quiet") &&
      strcmp (arg, "report") && strcmp (arg, "verbose")) {
    REQUIRE (
        state () == CONFIGURING,
        "can only set option 'set (\"%s\", %d)' right after initialization",
        arg, val);
  }
  bool res = internal->opts.set (arg, val);
  LOG_API_CALL_END ("set", arg, val, res);

  return res;
}